

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O0

void CheckStackTraceLeaf(int i)

{
  undefined8 uVar1;
  void *pvVar2;
  _func_int_void_ptr_ptr_int *p_Var3;
  int iVar4;
  reference ppvVar5;
  void **ppvVar6;
  void *pvVar7;
  void *unaff_retaddr;
  int local_5c;
  uint local_58;
  int j;
  int i_2;
  int i_1;
  char **strings;
  void *ra;
  int size;
  allocator<void_*> local_29;
  undefined1 local_28 [8];
  vector<void_*,_std::allocator<void_*>_> stack;
  int i_local;
  
  iVar4 = leaf_capture_len + 1;
  stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = i;
  std::allocator<void_*>::allocator(&local_29);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_28,(long)iVar4,&local_29);
  std::allocator<void_*>::~allocator(&local_29);
  ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)local_28,(long)leaf_capture_len);
  *ppvVar5 = (value_type)0x42;
  if (unaff_retaddr <= expected_range[1].start) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
            ,0x11a,"(&expected_range[1])->start","<","ra");
    abort();
  }
  if (expected_range[1].end < unaff_retaddr) {
    printf("Adjusting range from %p..%p to %p..%p\n",expected_range[1].start,expected_range[1].end,
           expected_range[1].start,unaff_retaddr);
    expected_range[1].end = unaff_retaddr;
  }
  p_Var3 = leaf_capture_fn;
  ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::data
                      ((vector<void_*,_std::allocator<void_*>_> *)local_28);
  iVar4 = (*p_Var3)(ppvVar6,leaf_capture_len);
  ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)local_28,(long)leaf_capture_len);
  if (*ppvVar5 != (value_type)0x42) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
            ,0x11d,"stack[leaf_capture_len]","==","(void*)0x42");
    abort();
  }
  ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::data
                      ((vector<void_*,_std::allocator<void_*>_> *)local_28);
  pvVar7 = (void *)backtrace_symbols(ppvVar6,iVar4);
  for (j = 0; j < iVar4; j = j + 1) {
    uVar1 = *(undefined8 *)((long)pvVar7 + (long)j * 8);
    ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_28,(long)j);
    printf("%s %p\n",uVar1,*ppvVar5);
  }
  printf("CheckStackTrace() addr: %p\n",CheckStackTrace);
  free(pvVar7);
  local_5c = 0;
  for (local_58 = 0; (int)local_58 < 6 && local_5c < iVar4; local_58 = local_58 + 1) {
    if ((local_58 == 1) && (local_5c == 1)) {
      local_58 = 0;
    }
    else {
      pvVar7 = expected_range[(int)local_58].start;
      pvVar2 = expected_range[(int)local_58].end;
      ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)local_28,(long)local_5c);
      printf("Backtrace %d: expected: %p..%p  actual: %p ... ",(ulong)local_58,pvVar7,pvVar2,
             *ppvVar5);
      fflush(_stdout);
      ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)local_28,(long)local_5c);
      CheckRetAddrIsInFunction(*ppvVar5,expected_range + (int)local_58);
      printf("OK\n");
    }
    local_5c = local_5c + 1;
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_28);
  return;
}

Assistant:

void ATTRIBUTE_NOINLINE CheckStackTraceLeaf(int i) {
  std::vector<void*> stack(leaf_capture_len + 1);
  stack[leaf_capture_len] = (void*)0x42;  // we will check that this value is not overwritten
  int size = 0;

  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[1]);

  size = leaf_capture_fn(stack.data(), leaf_capture_len);
  CHECK_EQ(stack[leaf_capture_len], (void*)0x42);

#ifdef HAVE_EXECINFO_H
  {
    char **strings = backtrace_symbols(stack.data(), size);
    for (int i = 0; i < size; i++)
      printf("%s %p\n", strings[i], stack[i]);
    printf("CheckStackTrace() addr: %p\n", &CheckStackTrace);
    free(strings);
  }
#endif

  for (int i = 0, j = 0; i < BACKTRACE_STEPS && j < size; i++, j++) {
    if (i == 1 && j == 1) {
      // this is expected to be our function for which we don't
      // establish bounds. So skip.
      i--;
      continue;
    }
    printf("Backtrace %d: expected: %p..%p  actual: %p ... ",
           i, expected_range[i].start, expected_range[i].end, stack[j]);
    fflush(stdout);
    CheckRetAddrIsInFunction(stack[j], expected_range[i]);
    printf("OK\n");
  }
}